

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O2

DecodeStatus DecodeAddrModeImm12Operand(MCInst *Inst,uint Val,uint64_t Address,void *Decoder)

{
  DecodeStatus DVar1;
  uint uVar2;
  ulong Val_00;
  uint uVar3;
  
  DVar1 = DecodeGPRRegisterClass(Inst,Val >> 0xd & 0xf,Address,Decoder);
  if ((DVar1 | 2) == MCDisassembler_Success) {
    uVar3 = Val >> 0xc & 1;
    uVar2 = -(Val & 0xfff);
    if (uVar3 != 0) {
      uVar2 = Val & 0xfff;
    }
    Val_00 = 0x80000000;
    if (uVar3 != 0 || uVar2 != 0) {
      Val_00 = (ulong)uVar2;
    }
    MCOperand_CreateImm0(Inst,Val_00);
  }
  else {
    DVar1 = MCDisassembler_Fail;
  }
  return DVar1;
}

Assistant:

static DecodeStatus DecodeAddrModeImm12Operand(MCInst *Inst, unsigned Val,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;

	unsigned add = fieldFromInstruction_4(Val, 12, 1);
	unsigned imm = fieldFromInstruction_4(Val, 0, 12);
	unsigned Rn = fieldFromInstruction_4(Val, 13, 4);

	if (!Check(&S, DecodeGPRRegisterClass(Inst, Rn, Address, Decoder)))
		return MCDisassembler_Fail;

	if (!add) imm *= (unsigned int)-1;
	if (imm == 0 && !add) imm = (unsigned int)INT32_MIN;
	MCOperand_CreateImm0(Inst, imm);
	//if (Rn == 15)
	//  tryAddingPcLoadReferenceComment(Address, Address + imm + 8, Decoder);

	return S;
}